

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cc
# Opt level: O1

void __thiscall WaveformGenerator::set_chip_model(WaveformGenerator *this,chip_model model)

{
  reg8 *prVar1;
  reg8 *prVar2;
  reg8 *prVar3;
  reg8 *prVar4;
  bool bVar5;
  
  bVar5 = model == MOS6581;
  prVar1 = wave8580__ST;
  if (bVar5) {
    prVar1 = wave6581__ST;
  }
  prVar2 = wave8580_P_T;
  if (bVar5) {
    prVar2 = wave6581_P_T;
  }
  prVar3 = wave8580_PS_;
  if (bVar5) {
    prVar3 = wave6581_PS_;
  }
  prVar4 = wave8580_PST;
  if (bVar5) {
    prVar4 = wave6581_PST;
  }
  this->wave__ST = prVar1;
  this->wave_P_T = prVar2;
  this->wave_PS_ = prVar3;
  this->wave_PST = prVar4;
  return;
}

Assistant:

void WaveformGenerator::set_chip_model(chip_model model)
{
  if (model == MOS6581) {
    wave__ST = wave6581__ST;
    wave_P_T = wave6581_P_T;
    wave_PS_ = wave6581_PS_;
    wave_PST = wave6581_PST;
  }
  else {
    wave__ST = wave8580__ST;
    wave_P_T = wave8580_P_T;
    wave_PS_ = wave8580_PS_;
    wave_PST = wave8580_PST;
  }
}